

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariablesHelper.cxx
# Opt level: O0

shared_ptr<cmDebugger::cmDebuggerVariables> __thiscall
cmDebugger::cmDebuggerVariablesHelper::CreateIfAny
          (cmDebuggerVariablesHelper *this,
          shared_ptr<cmDebugger::cmDebuggerVariablesManager> *variablesManager,string *name,
          bool supportsVariableType,cmBTStringRange *entries)

{
  string *__args_1;
  bool bVar1;
  reference __args_2;
  element_type *peVar2;
  difference_type __val;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<cmDebugger::cmDebuggerVariables> sVar4;
  string local_c8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_a8;
  undefined1 local_78 [8];
  shared_ptr<cmDebugger::cmDebuggerVariables> arrayVariables;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *entry;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __end1;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_48;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __begin1;
  cmBTStringRange *__range1;
  cmBTStringRange *entries_local;
  string *psStack_20;
  bool supportsVariableType_local;
  string *name_local;
  shared_ptr<cmDebugger::cmDebuggerVariablesManager> *variablesManager_local;
  shared_ptr<cmDebugger::cmDebuggerVariables> *sourceEntries;
  
  entries_local._7_1_ = supportsVariableType;
  psStack_20 = name;
  name_local = (string *)variablesManager;
  variablesManager_local = (shared_ptr<cmDebugger::cmDebuggerVariablesManager> *)this;
  bVar1 = cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::empty(entries);
  if (bVar1) {
    std::shared_ptr<cmDebugger::cmDebuggerVariables>::shared_ptr
              ((shared_ptr<cmDebugger::cmDebuggerVariables> *)this);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    std::
    make_shared<cmDebugger::cmDebuggerVariables,std::shared_ptr<cmDebugger::cmDebuggerVariablesManager>const&,std::__cxx11::string_const&,bool&>
              ((shared_ptr<cmDebugger::cmDebuggerVariablesManager> *)this,name_local,
               (bool *)psStack_20);
    __begin1._M_current =
         (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
         entries;
    local_48 = cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::begin(entries);
    entry = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
            cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::end(__begin1._M_current);
    while (bVar1 = __gnu_cxx::operator!=
                             (&local_48,
                              (__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&entry), bVar1) {
      __args_2 = __gnu_cxx::
                 __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator*(&local_48);
      __args_1 = name_local;
      arrayVariables.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__args_2;
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                (&local_a8,__args_2);
      std::
      make_shared<cmDebugger::cmDebuggerVariables,std::shared_ptr<cmDebugger::cmDebuggerVariablesManager>const&,std::__cxx11::string_const&,bool&,cmDebugger::cmDebuggerVariablesHelper::CreateIfAny(std::shared_ptr<cmDebugger::cmDebuggerVariablesManager>const&,std::__cxx11::string_const&,bool,cmRange<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>const&)::__0>
                ((shared_ptr<cmDebugger::cmDebuggerVariablesManager> *)local_78,__args_1,
                 (bool *)__args_2,(anon_class_48_1_a7dcf792 *)((long)&entries_local + 7));
      CreateIfAny(std::shared_ptr<cmDebugger::cmDebuggerVariablesManager>const&,std::__cxx11::string_const&,bool,cmRange<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>const&)
      ::$_0::~__0((__0 *)&local_a8);
      peVar2 = std::
               __shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_78);
      cmDebuggerVariables::SetEnableSorting(peVar2,false);
      peVar2 = std::
               __shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      cmDebuggerVariables::AddSubVariables
                (peVar2,(shared_ptr<cmDebugger::cmDebuggerVariables> *)local_78);
      std::shared_ptr<cmDebugger::cmDebuggerVariables>::~shared_ptr
                ((shared_ptr<cmDebugger::cmDebuggerVariables> *)local_78);
      __gnu_cxx::
      __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&local_48);
    }
    peVar2 = std::
             __shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    __val = cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::size(entries);
    std::__cxx11::to_string(&local_c8,__val);
    cmDebuggerVariables::SetValue(peVar2,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cmDebugger::cmDebuggerVariables>)
         sVar4.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<cmDebuggerVariables> cmDebuggerVariablesHelper::CreateIfAny(
  std::shared_ptr<cmDebuggerVariablesManager> const& variablesManager,
  std::string const& name, bool supportsVariableType,
  cmBTStringRange const& entries)
{
  if (entries.empty()) {
    return {};
  }

  auto sourceEntries = std::make_shared<cmDebuggerVariables>(
    variablesManager, name, supportsVariableType);

  for (auto const& entry : entries) {
    auto arrayVariables = std::make_shared<cmDebuggerVariables>(
      variablesManager, entry.Value, supportsVariableType, [=]() {
        cmList items{ entry.Value };
        std::vector<cmDebuggerVariableEntry> ret;
        ret.reserve(items.size());
        int i = 0;
        for (std::string const& item : items) {
          ret.emplace_back("[" + std::to_string(i++) + "]", item);
        }
        return ret;
      });
    arrayVariables->SetEnableSorting(false);
    sourceEntries->AddSubVariables(arrayVariables);
  }

  sourceEntries->SetValue(std::to_string(entries.size()));
  return sourceEntries;
}